

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v9::basic_memory_buffer<int,_500UL,_std::allocator<int>_>::grow
          (basic_memory_buffer<int,_500UL,_std::allocator<int>_> *this,size_t size)

{
  size_t sVar1;
  ulong uVar2;
  buffer<int> *pbVar3;
  pointer p;
  ulong in_RSI;
  buffer<int> *in_RDI;
  int *new_data;
  int *old_data;
  size_t new_capacity;
  size_t old_capacity;
  size_t max_size;
  int *in_stack_ffffffffffffff98;
  allocator_type *in_stack_ffffffffffffffa0;
  buffer<int> *this_00;
  buffer<int> *__last;
  int *__first;
  size_type local_48;
  size_type local_28;
  
  detail::abort_fuzzing_if(false);
  local_48 = std::allocator_traits<std::allocator<int>_>::max_size((allocator_type *)0x1c2900);
  sVar1 = detail::buffer<int>::capacity(in_RDI);
  uVar2 = sVar1 + (sVar1 >> 1);
  local_28 = in_RSI;
  if ((in_RSI <= uVar2) && (local_28 = uVar2, local_48 < uVar2)) {
    if (local_48 < in_RSI) {
      local_48 = in_RSI;
    }
    local_28 = local_48;
  }
  pbVar3 = (buffer<int> *)detail::buffer<int>::data(in_RDI);
  p = std::allocator_traits<std::allocator<int>_>::allocate
                (in_stack_ffffffffffffffa0,(size_type)in_stack_ffffffffffffff98);
  this_00 = pbVar3;
  __last = pbVar3;
  sVar1 = detail::buffer<int>::size(in_RDI);
  __first = (int *)((long)&this_00->_vptr_buffer + sVar1 * 4);
  detail::make_checked<int>(p,local_28);
  std::uninitialized_copy<int*,int*>(__first,(int *)__last,(int *)this_00);
  detail::buffer<int>::set(in_RDI,p,local_28);
  if (pbVar3 != in_RDI + 1) {
    __gnu_cxx::new_allocator<int>::deallocate
              ((new_allocator<int> *)this_00,in_stack_ffffffffffffff98,0x1c2a3a);
  }
  return;
}

Assistant:

FMT_CONSTEXPR20 void basic_memory_buffer<T, SIZE, Allocator>::grow(
    size_t size) {
  detail::abort_fuzzing_if(size > 5000);
  const size_t max_size = std::allocator_traits<Allocator>::max_size(alloc_);
  size_t old_capacity = this->capacity();
  size_t new_capacity = old_capacity + old_capacity / 2;
  if (size > new_capacity)
    new_capacity = size;
  else if (new_capacity > max_size)
    new_capacity = size > max_size ? size : max_size;
  T* old_data = this->data();
  T* new_data =
      std::allocator_traits<Allocator>::allocate(alloc_, new_capacity);
  // The following code doesn't throw, so the raw pointer above doesn't leak.
  std::uninitialized_copy(old_data, old_data + this->size(),
                          detail::make_checked(new_data, new_capacity));
  this->set(new_data, new_capacity);
  // deallocate must not throw according to the standard, but even if it does,
  // the buffer already uses the new storage and will deallocate it in
  // destructor.
  if (old_data != store_) alloc_.deallocate(old_data, old_capacity);
}